

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::NonarrayType> __thiscall
mocker::Parser::nonarrayType(Parser *this,TokIter *iter,TokIter end)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Token *pTVar3;
  mapped_type *pmVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<mocker::ast::BuiltinType> sVar6;
  shared_ptr<mocker::ast::Identifier> sVar7;
  shared_ptr<mocker::ast::UserDefinedType> sVar8;
  shared_ptr<mocker::ast::NonarrayType> sVar9;
  Position beg;
  shared_ptr<mocker::ast::BuiltinType> res;
  undefined1 local_50 [24];
  Token *local_38;
  Token *local_30;
  
  sVar6 = builtinType((Parser *)local_50,iter,end);
  uVar2 = local_50._8_8_;
  uVar1 = local_50._0_8_;
  _Var5 = sVar6.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi;
  if ((Token *)local_50._0_8_ != (Token *)0x0) {
    (this->tokBeg)._M_current = (Token *)local_50._0_8_;
    (this->tokEnd)._M_current = (Token *)0x0;
    local_50._8_8_ = (Token *)0x0;
    (this->tokEnd)._M_current = (Token *)uVar2;
    local_50._0_8_ = (Token *)0x0;
  }
  if ((Token *)local_50._8_8_ != (Token *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
    _Var5._M_pi = extraout_RDX;
  }
  if ((Token *)uVar1 == (Token *)0x0) {
    sVar7 = identifier((Parser *)local_50,iter,end);
    uVar1 = local_50._0_8_;
    _Var5 = sVar7.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if ((Token *)local_50._0_8_ != (Token *)0x0) {
      local_30 = (Token *)local_50._0_8_;
      pmVar4 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)iter[2]._M_current,(key_type *)&local_30);
      beg.col = (pmVar4->first).line;
      beg.line = (size_t)iter;
      sVar8 = makeNode<mocker::ast::UserDefinedType,std::shared_ptr<mocker::ast::Identifier>&>
                        ((Parser *)(local_50 + 0x10),beg,*(Position *)&(pmVar4->first).col,
                         (shared_ptr<mocker::ast::Identifier> *)(pmVar4->second).col);
      pTVar3 = local_38;
      _Var5 = sVar8.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      (this->tokBeg)._M_current = (Token *)local_50._16_8_;
      (this->tokEnd)._M_current = (Token *)0x0;
      local_38 = (Token *)0x0;
      (this->tokEnd)._M_current = pTVar3;
    }
    if ((Token *)local_50._8_8_ != (Token *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      _Var5._M_pi = extraout_RDX_00;
    }
    if ((Token *)uVar1 == (Token *)0x0) {
      (this->tokBeg)._M_current = (Token *)0x0;
      (this->tokEnd)._M_current = (Token *)0x0;
    }
  }
  sVar9.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var5._M_pi;
  sVar9.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::NonarrayType>)
         sVar9.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::NonarrayType> Parser::nonarrayType(TokIter &iter,
                                                        TokIter end) {
  if (auto res = builtinType(iter, end))
    return res;
  if (auto id = identifier(iter, end))
    return makeNode<ast::UserDefinedType>(pos[id->getID()], id);
  return nullptr;
}